

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O1

ssize_t __thiscall llvm::raw_ostream::write(raw_ostream *this,int __fd,void *__buf,size_t __n)

{
  char *pcVar1;
  undefined8 in_RAX;
  ulong uVar2;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  do {
    uStack_28 = CONCAT17((char)__fd,(undefined7)uStack_28);
    if (this->OutBufCur < this->OutBufEnd) goto LAB_00db48ba;
    uVar2 = write((int)this,(void *)((long)&uStack_28 + 7),(long)&uStack_28 + 6);
    __fd = (int)uStack_28._6_1_;
  } while ((short)uVar2 == 1);
  if ((uVar2 & 0xffff) != 0) {
LAB_00db48ba:
    pcVar1 = this->OutBufCur;
    this->OutBufCur = pcVar1 + 1;
    *pcVar1 = uStack_28._7_1_;
  }
  return (ssize_t)this;
}

Assistant:

raw_ostream &raw_ostream::write(unsigned char C) {
  // Group exceptional cases into a single branch.
  if (LLVM_UNLIKELY(OutBufCur >= OutBufEnd)) {
    if (LLVM_UNLIKELY(!OutBufStart)) {
      if (BufferMode == BufferKind::Unbuffered) {
        write_impl(reinterpret_cast<char*>(&C), 1);
        return *this;
      }
      // Set up a buffer and start over.
      SetBuffered();
      return write(C);
    }

    flush_nonempty();
  }

  *OutBufCur++ = C;
  return *this;
}